

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O2

void secp256k1_sha256_write(secp256k1_sha256 *hash,uchar *data,size_t len)

{
  uchar *p;
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uchar *local_140;
  ulong uVar30;
  
  uVar26 = hash->bytes;
  hash->bytes = uVar26 + len;
  if (CARRY8(uVar26,len)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/hash_impl.h"
            ,0x81,"test condition failed: hash->bytes >= len");
    abort();
  }
  uVar27 = (uint)uVar26 & 0x3f;
  p = hash->buf;
  local_140 = data;
  while( true ) {
    uVar30 = (ulong)uVar27;
    uVar26 = 0x40 - uVar30;
    if (len < uVar26) break;
    memcpy(p + uVar30,local_140,uVar26);
    local_140 = local_140 + uVar26;
    uVar27 = hash->s[0];
    uVar1 = hash->s[1];
    uVar2 = hash->s[2];
    uVar3 = hash->s[3];
    uVar4 = hash->s[4];
    uVar5 = hash->s[5];
    uVar6 = hash->s[6];
    uVar7 = hash->s[7];
    uVar48 = (uVar6 ^ uVar5) & uVar4 ^ uVar6;
    uVar8 = secp256k1_read_be32(p);
    iVar24 = ((uVar4 << 7 | uVar4 >> 0x19) ^
             (uVar4 << 0x15 | uVar4 >> 0xb) ^ (uVar4 << 0x1a | uVar4 >> 6)) + uVar7 + uVar8;
    uVar45 = ((uVar1 | uVar27) & uVar2 | uVar1 & uVar27) +
             ((uVar27 << 10 | uVar27 >> 0x16) ^
             (uVar27 << 0x13 | uVar27 >> 0xd) ^ (uVar27 << 0x1e | uVar27 >> 2)) +
             uVar48 + iVar24 + 0x428a2f98;
    uVar48 = uVar3 + iVar24 + uVar48 + 0x428a2f98;
    uVar25 = (uVar48 * 0x80 | uVar48 >> 0x19) ^
             (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6);
    uVar9 = secp256k1_read_be32(hash->buf + 4);
    iVar24 = ((uVar5 ^ uVar4) & uVar48 ^ uVar5) + uVar6 + uVar9;
    uVar28 = ((uVar45 | uVar27) & uVar1 | uVar45 & uVar27) +
             ((uVar45 * 0x400 | uVar45 >> 0x16) ^
             (uVar45 * 0x80000 | uVar45 >> 0xd) ^ (uVar45 * 0x40000000 | uVar45 >> 2)) +
             uVar25 + iVar24 + 0x71374491;
    uVar39 = uVar2 + iVar24 + uVar25 + 0x71374491;
    uVar25 = (uVar39 * 0x80 | uVar39 >> 0x19) ^
             (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6);
    uVar10 = secp256k1_read_be32(hash->buf + 8);
    iVar24 = ((uVar48 ^ uVar4) & uVar39 ^ uVar4) + uVar5 + uVar10;
    uVar29 = ((uVar28 | uVar45) & uVar27 | uVar28 & uVar45) +
             ((uVar28 * 0x400 | uVar28 >> 0x16) ^
             (uVar28 * 0x80000 | uVar28 >> 0xd) ^ (uVar28 * 0x40000000 | uVar28 >> 2)) +
             uVar25 + iVar24 + -0x4a3f0431;
    uVar25 = iVar24 + uVar25 + uVar1 + 0xb5c0fbcf;
    uVar52 = (uVar25 * 0x80 | uVar25 >> 0x19) ^
             (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6);
    uVar11 = secp256k1_read_be32(hash->buf + 0xc);
    iVar24 = ((uVar39 ^ uVar48) & uVar25 ^ uVar48) + uVar4 + uVar11;
    uVar49 = ((uVar29 | uVar28) & uVar45 | uVar29 & uVar28) +
             ((uVar29 * 0x400 | uVar29 >> 0x16) ^
             (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) +
             uVar52 + iVar24 + -0x164a245b;
    uVar53 = uVar27 + uVar52 + iVar24 + 0xe9b5dba5;
    uVar12 = secp256k1_read_be32(hash->buf + 0x10);
    iVar24 = uVar48 + uVar12 + ((uVar25 ^ uVar39) & uVar53 ^ uVar39) +
             ((uVar53 * 0x80 | uVar53 >> 0x19) ^
             (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) + 0x3956c25b;
    uVar45 = uVar45 + iVar24;
    uVar40 = ((uVar49 | uVar29) & uVar28 | uVar49 & uVar29) +
             ((uVar49 * 0x400 | uVar49 >> 0x16) ^
             (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar24;
    uVar13 = secp256k1_read_be32(hash->buf + 0x14);
    iVar24 = uVar39 + uVar13 + ((uVar53 ^ uVar25) & uVar45 ^ uVar25) +
             ((uVar45 * 0x80 | uVar45 >> 0x19) ^
             (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6)) + 0x59f111f1;
    uVar28 = uVar28 + iVar24;
    uVar52 = ((uVar40 | uVar49) & uVar29 | uVar40 & uVar49) +
             ((uVar40 * 0x400 | uVar40 >> 0x16) ^
             (uVar40 * 0x80000 | uVar40 >> 0xd) ^ (uVar40 * 0x40000000 | uVar40 >> 2)) + iVar24;
    uVar14 = secp256k1_read_be32(hash->buf + 0x18);
    iVar24 = uVar25 + uVar14 + ((uVar45 ^ uVar53) & uVar28 ^ uVar53) +
             ((uVar28 * 0x80 | uVar28 >> 0x19) ^
             (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) + -0x6dc07d5c
    ;
    uVar29 = uVar29 + iVar24;
    uVar39 = ((uVar52 | uVar40) & uVar49 | uVar52 & uVar40) +
             ((uVar52 * 0x400 | uVar52 >> 0x16) ^
             (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar24;
    uVar15 = secp256k1_read_be32(hash->buf + 0x1c);
    iVar24 = uVar53 + uVar15 + ((uVar28 ^ uVar45) & uVar29 ^ uVar45) +
             ((uVar29 * 0x80 | uVar29 >> 0x19) ^
             (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) + -0x54e3a12b
    ;
    uVar49 = uVar49 + iVar24;
    uVar46 = ((uVar39 | uVar52) & uVar40 | uVar39 & uVar52) +
             ((uVar39 * 0x400 | uVar39 >> 0x16) ^
             (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2)) + iVar24;
    uVar16 = secp256k1_read_be32(hash->buf + 0x20);
    iVar24 = ((uVar49 * 0x80 | uVar49 >> 0x19) ^
             (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) +
             uVar45 + uVar16 + ((uVar29 ^ uVar28) & uVar49 ^ uVar28) + -0x27f85568;
    uVar40 = uVar40 + iVar24;
    uVar48 = ((uVar46 | uVar39) & uVar52 | uVar46 & uVar39) +
             ((uVar46 * 0x400 | uVar46 >> 0x16) ^
             (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar24;
    uVar17 = secp256k1_read_be32(hash->buf + 0x24);
    iVar24 = ((uVar40 * 0x80 | uVar40 >> 0x19) ^
             (uVar40 * 0x200000 | uVar40 >> 0xb) ^ (uVar40 * 0x4000000 | uVar40 >> 6)) +
             uVar28 + uVar17 + ((uVar49 ^ uVar29) & uVar40 ^ uVar29) + 0x12835b01;
    uVar52 = uVar52 + iVar24;
    uVar25 = ((uVar48 | uVar46) & uVar39 | uVar48 & uVar46) +
             ((uVar48 * 0x400 | uVar48 >> 0x16) ^
             (uVar48 * 0x80000 | uVar48 >> 0xd) ^ (uVar48 * 0x40000000 | uVar48 >> 2)) + iVar24;
    uVar18 = secp256k1_read_be32(hash->buf + 0x28);
    iVar24 = ((uVar52 * 0x80 | uVar52 >> 0x19) ^
             (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6)) +
             uVar29 + uVar18 + ((uVar40 ^ uVar49) & uVar52 ^ uVar49) + 0x243185be;
    uVar39 = uVar39 + iVar24;
    uVar28 = ((uVar25 | uVar48) & uVar46 | uVar25 & uVar48) +
             ((uVar25 * 0x400 | uVar25 >> 0x16) ^
             (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar24;
    uVar19 = secp256k1_read_be32(hash->buf + 0x2c);
    iVar24 = ((uVar39 * 0x80 | uVar39 >> 0x19) ^
             (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6)) +
             uVar49 + uVar19 + ((uVar52 ^ uVar40) & uVar39 ^ uVar40) + 0x550c7dc3;
    uVar46 = uVar46 + iVar24;
    uVar53 = ((uVar28 | uVar25) & uVar48 | uVar28 & uVar25) +
             ((uVar28 * 0x400 | uVar28 >> 0x16) ^
             (uVar28 * 0x80000 | uVar28 >> 0xd) ^ (uVar28 * 0x40000000 | uVar28 >> 2)) + iVar24;
    uVar20 = secp256k1_read_be32(hash->buf + 0x30);
    iVar24 = ((uVar46 * 0x80 | uVar46 >> 0x19) ^
             (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
             uVar40 + uVar20 + ((uVar39 ^ uVar52) & uVar46 ^ uVar52) + 0x72be5d74;
    uVar48 = uVar48 + iVar24;
    uVar41 = ((uVar53 | uVar28) & uVar25 | uVar53 & uVar28) +
             ((uVar53 * 0x400 | uVar53 >> 0x16) ^
             (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar24;
    uVar21 = secp256k1_read_be32(hash->buf + 0x34);
    iVar24 = ((uVar48 * 0x80 | uVar48 >> 0x19) ^
             (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6)) +
             uVar52 + uVar21 + ((uVar46 ^ uVar39) & uVar48 ^ uVar39) + -0x7f214e02;
    uVar25 = uVar25 + iVar24;
    uVar29 = ((uVar41 | uVar53) & uVar28 | uVar41 & uVar53) +
             ((uVar41 * 0x400 | uVar41 >> 0x16) ^
             (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar24;
    uVar22 = secp256k1_read_be32(hash->buf + 0x38);
    iVar24 = ((uVar25 * 0x80 | uVar25 >> 0x19) ^
             (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) +
             uVar39 + uVar22 + ((uVar48 ^ uVar46) & uVar25 ^ uVar46) + -0x6423f959;
    uVar28 = uVar28 + iVar24;
    uVar40 = ((uVar29 | uVar41) & uVar53 | uVar29 & uVar41) +
             ((uVar29 * 0x400 | uVar29 >> 0x16) ^
             (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar24;
    uVar23 = secp256k1_read_be32(hash->buf + 0x3c);
    iVar24 = ((uVar28 * 0x80 | uVar28 >> 0x19) ^
             (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
             uVar46 + uVar23 + ((uVar25 ^ uVar48) & uVar28 ^ uVar48) + -0x3e640e8c;
    uVar53 = uVar53 + iVar24;
    uVar45 = ((uVar40 | uVar29) & uVar41 | uVar40 & uVar29) +
             ((uVar40 * 0x400 | uVar40 >> 0x16) ^
             (uVar40 * 0x80000 | uVar40 >> 0xd) ^ (uVar40 * 0x40000000 | uVar40 >> 2)) + iVar24;
    uVar31 = uVar8 + uVar17 +
             (uVar9 >> 3 ^ (uVar9 << 0xe | uVar9 >> 0x12) ^ (uVar9 << 0x19 | uVar9 >> 7)) +
             (uVar22 >> 10 ^ (uVar22 << 0xd | uVar22 >> 0x13) ^ (uVar22 << 0xf | uVar22 >> 0x11));
    iVar24 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
             (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
             uVar48 + uVar31 + ((uVar28 ^ uVar25) & uVar53 ^ uVar25) + -0x1b64963f;
    uVar41 = uVar41 + iVar24;
    uVar49 = ((uVar45 | uVar40) & uVar29 | uVar45 & uVar40) +
             ((uVar45 * 0x400 | uVar45 >> 0x16) ^
             (uVar45 * 0x80000 | uVar45 >> 0xd) ^ (uVar45 * 0x40000000 | uVar45 >> 2)) + iVar24;
    uVar48 = uVar9 + uVar18 +
             (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7)) +
             (uVar23 >> 10 ^ (uVar23 << 0xd | uVar23 >> 0x13) ^ (uVar23 << 0xf | uVar23 >> 0x11));
    iVar24 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
             (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
             uVar25 + uVar48 + ((uVar53 ^ uVar28) & uVar41 ^ uVar28) + -0x1041b87a;
    uVar29 = uVar29 + iVar24;
    uVar39 = ((uVar49 | uVar45) & uVar40 | uVar49 & uVar45) +
             ((uVar49 * 0x400 | uVar49 >> 0x16) ^
             (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar24;
    uVar32 = uVar10 + uVar19 +
             (uVar11 >> 3 ^ (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7)) +
             (uVar31 >> 10 ^ (uVar31 * 0x2000 | uVar31 >> 0x13) ^ (uVar31 * 0x8000 | uVar31 >> 0x11)
             );
    iVar24 = ((uVar29 * 0x80 | uVar29 >> 0x19) ^
             (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) +
             uVar28 + uVar32 + ((uVar41 ^ uVar53) & uVar29 ^ uVar53) + 0xfc19dc6;
    uVar40 = uVar40 + iVar24;
    uVar25 = ((uVar39 | uVar49) & uVar45 | uVar39 & uVar49) +
             ((uVar39 * 0x400 | uVar39 >> 0x16) ^
             (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2)) + iVar24;
    uVar36 = uVar11 + uVar20 +
             (uVar12 >> 3 ^ (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) +
             (uVar48 >> 10 ^ (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11)
             );
    iVar24 = ((uVar40 * 0x80 | uVar40 >> 0x19) ^
             (uVar40 * 0x200000 | uVar40 >> 0xb) ^ (uVar40 * 0x4000000 | uVar40 >> 6)) +
             uVar53 + uVar36 + ((uVar29 ^ uVar41) & uVar40 ^ uVar41) + 0x240ca1cc;
    uVar45 = uVar45 + iVar24;
    uVar52 = ((uVar25 | uVar39) & uVar49 | uVar25 & uVar39) +
             ((uVar25 * 0x400 | uVar25 >> 0x16) ^
             (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar24;
    uVar28 = uVar12 + uVar21 +
             (uVar13 >> 3 ^ (uVar13 << 0xe | uVar13 >> 0x12) ^ (uVar13 << 0x19 | uVar13 >> 7)) +
             (uVar32 >> 10 ^ (uVar32 * 0x2000 | uVar32 >> 0x13) ^ (uVar32 * 0x8000 | uVar32 >> 0x11)
             );
    iVar24 = ((uVar45 * 0x80 | uVar45 >> 0x19) ^
             (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6)) +
             uVar41 + uVar28 + ((uVar40 ^ uVar29) & uVar45 ^ uVar29) + 0x2de92c6f;
    uVar49 = uVar49 + iVar24;
    uVar54 = ((uVar52 | uVar25) & uVar39 | uVar52 & uVar25) +
             ((uVar52 * 0x400 | uVar52 >> 0x16) ^
             (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar24;
    uVar34 = uVar13 + uVar22 +
             (uVar14 >> 3 ^ (uVar14 << 0xe | uVar14 >> 0x12) ^ (uVar14 << 0x19 | uVar14 >> 7)) +
             (uVar36 >> 10 ^ (uVar36 * 0x2000 | uVar36 >> 0x13) ^ (uVar36 * 0x8000 | uVar36 >> 0x11)
             );
    iVar24 = ((uVar49 * 0x80 | uVar49 >> 0x19) ^
             (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) +
             uVar29 + uVar34 + ((uVar45 ^ uVar40) & uVar49 ^ uVar40) + 0x4a7484aa;
    uVar39 = uVar39 + iVar24;
    uVar33 = ((uVar54 | uVar52) & uVar25 | uVar54 & uVar52) +
             ((uVar54 * 0x400 | uVar54 >> 0x16) ^
             (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar24;
    uVar42 = uVar14 + uVar23 +
             (uVar15 >> 3 ^ (uVar15 << 0xe | uVar15 >> 0x12) ^ (uVar15 << 0x19 | uVar15 >> 7)) +
             (uVar28 >> 10 ^ (uVar28 * 0x2000 | uVar28 >> 0x13) ^ (uVar28 * 0x8000 | uVar28 >> 0x11)
             );
    iVar24 = ((uVar39 * 0x80 | uVar39 >> 0x19) ^
             (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6)) +
             uVar40 + uVar42 + ((uVar49 ^ uVar45) & uVar39 ^ uVar45) + 0x5cb0a9dc;
    uVar25 = uVar25 + iVar24;
    uVar53 = ((uVar33 | uVar54) & uVar52 | uVar33 & uVar54) +
             ((uVar33 * 0x400 | uVar33 >> 0x16) ^
             (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar24;
    uVar41 = (uVar16 >> 3 ^ (uVar16 << 0xe | uVar16 >> 0x12) ^ (uVar16 << 0x19 | uVar16 >> 7)) +
             uVar15 + uVar31 +
             (uVar34 >> 10 ^ (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11)
             );
    iVar24 = ((uVar25 * 0x80 | uVar25 >> 0x19) ^
             (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) +
             uVar45 + uVar41 + ((uVar39 ^ uVar49) & uVar25 ^ uVar49) + 0x76f988da;
    uVar52 = uVar52 + iVar24;
    uVar35 = ((uVar53 | uVar33) & uVar54 | uVar53 & uVar33) +
             ((uVar53 * 0x400 | uVar53 >> 0x16) ^
             (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar24;
    uVar46 = (uVar17 >> 3 ^ (uVar17 << 0xe | uVar17 >> 0x12) ^ (uVar17 << 0x19 | uVar17 >> 7)) +
             uVar16 + uVar48 +
             (uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11)
             );
    iVar24 = ((uVar52 * 0x80 | uVar52 >> 0x19) ^
             (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6)) +
             uVar49 + uVar46 + ((uVar25 ^ uVar39) & uVar52 ^ uVar39) + -0x67c1aeae;
    uVar54 = uVar54 + iVar24;
    uVar50 = ((uVar35 | uVar53) & uVar33 | uVar35 & uVar53) +
             ((uVar35 * 0x400 | uVar35 >> 0x16) ^
             (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar24;
    uVar45 = (uVar18 >> 3 ^ (uVar18 << 0xe | uVar18 >> 0x12) ^ (uVar18 << 0x19 | uVar18 >> 7)) +
             uVar17 + uVar32 +
             (uVar41 >> 10 ^ (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11)
             );
    iVar24 = uVar39 + uVar45 + ((uVar52 ^ uVar25) & uVar54 ^ uVar25) +
             ((uVar54 * 0x80 | uVar54 >> 0x19) ^
             (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) + -0x57ce3993
    ;
    uVar33 = uVar33 + iVar24;
    uVar37 = ((uVar50 | uVar35) & uVar53 | uVar50 & uVar35) +
             ((uVar50 * 0x400 | uVar50 >> 0x16) ^
             (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar24;
    uVar47 = (uVar19 >> 3 ^ (uVar19 << 0xe | uVar19 >> 0x12) ^ (uVar19 << 0x19 | uVar19 >> 7)) +
             uVar18 + uVar36 +
             (uVar46 >> 10 ^ (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11)
             );
    iVar24 = uVar25 + uVar47 + ((uVar54 ^ uVar52) & uVar33 ^ uVar52) +
             ((uVar33 * 0x80 | uVar33 >> 0x19) ^
             (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) + -0x4ffcd838
    ;
    uVar53 = uVar53 + iVar24;
    uVar40 = ((uVar37 | uVar50) & uVar35 | uVar37 & uVar50) +
             ((uVar37 * 0x400 | uVar37 >> 0x16) ^
             (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar24;
    uVar38 = (uVar20 >> 3 ^ (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) +
             uVar19 + uVar28 +
             (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11)
             );
    iVar24 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
             (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
             uVar52 + uVar38 + ((uVar33 ^ uVar54) & uVar53 ^ uVar54) + -0x40a68039;
    uVar35 = uVar35 + iVar24;
    uVar25 = ((uVar40 | uVar37) & uVar50 | uVar40 & uVar37) +
             ((uVar40 * 0x400 | uVar40 >> 0x16) ^
             (uVar40 * 0x80000 | uVar40 >> 0xd) ^ (uVar40 * 0x40000000 | uVar40 >> 2)) + iVar24;
    uVar29 = (uVar21 >> 3 ^ (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7)) +
             uVar20 + uVar34 +
             (uVar47 >> 10 ^ (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11)
             );
    iVar24 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
             (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
             uVar54 + uVar29 + ((uVar53 ^ uVar33) & uVar35 ^ uVar33) + -0x391ff40d;
    uVar50 = uVar50 + iVar24;
    uVar55 = ((uVar25 | uVar40) & uVar37 | uVar25 & uVar40) +
             ((uVar25 * 0x400 | uVar25 >> 0x16) ^
             (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar24;
    uVar49 = (uVar22 >> 3 ^ (uVar22 << 0xe | uVar22 >> 0x12) ^ (uVar22 << 0x19 | uVar22 >> 7)) +
             uVar21 + uVar42 +
             (uVar38 >> 10 ^ (uVar38 * 0x2000 | uVar38 >> 0x13) ^ (uVar38 * 0x8000 | uVar38 >> 0x11)
             );
    iVar24 = ((uVar50 * 0x80 | uVar50 >> 0x19) ^
             (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) +
             uVar33 + uVar49 + ((uVar35 ^ uVar53) & uVar50 ^ uVar53) + -0x2a586eb9;
    uVar37 = uVar37 + iVar24;
    uVar39 = ((uVar55 | uVar25) & uVar40 | uVar55 & uVar25) +
             ((uVar55 * 0x400 | uVar55 >> 0x16) ^
             (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar24;
    uVar56 = (uVar23 >> 3 ^ (uVar23 << 0xe | uVar23 >> 0x12) ^ (uVar23 << 0x19 | uVar23 >> 7)) +
             uVar22 + uVar41 +
             (uVar29 >> 10 ^ (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11)
             );
    iVar24 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
             (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
             uVar53 + uVar56 + ((uVar50 ^ uVar35) & uVar37 ^ uVar35) + 0x6ca6351;
    uVar40 = uVar40 + iVar24;
    uVar54 = ((uVar39 | uVar55) & uVar25 | uVar39 & uVar55) +
             ((uVar39 * 0x400 | uVar39 >> 0x16) ^
             (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2)) + iVar24;
    uVar43 = (uVar31 >> 3 ^ (uVar31 * 0x4000 | uVar31 >> 0x12) ^ (uVar31 * 0x2000000 | uVar31 >> 7))
             + uVar23 + uVar46 +
             (uVar49 >> 10 ^ (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11)
             );
    iVar24 = ((uVar40 * 0x80 | uVar40 >> 0x19) ^
             (uVar40 * 0x200000 | uVar40 >> 0xb) ^ (uVar40 * 0x4000000 | uVar40 >> 6)) +
             uVar35 + uVar43 + ((uVar37 ^ uVar50) & uVar40 ^ uVar50) + 0x14292967;
    uVar25 = uVar25 + iVar24;
    uVar53 = ((uVar54 | uVar39) & uVar55 | uVar54 & uVar39) +
             ((uVar54 * 0x400 | uVar54 >> 0x16) ^
             (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar24;
    uVar33 = (uVar48 >> 3 ^ (uVar48 * 0x4000 | uVar48 >> 0x12) ^ (uVar48 * 0x2000000 | uVar48 >> 7))
             + uVar31 + uVar45 +
             (uVar56 >> 10 ^ (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11)
             );
    iVar24 = ((uVar25 * 0x80 | uVar25 >> 0x19) ^
             (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) +
             uVar50 + uVar33 + ((uVar40 ^ uVar37) & uVar25 ^ uVar37) + 0x27b70a85;
    uVar55 = uVar55 + iVar24;
    uVar35 = ((uVar53 | uVar54) & uVar39 | uVar53 & uVar54) +
             ((uVar53 * 0x400 | uVar53 >> 0x16) ^
             (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar24;
    uVar52 = (uVar32 >> 3 ^ (uVar32 * 0x4000 | uVar32 >> 0x12) ^ (uVar32 * 0x2000000 | uVar32 >> 7))
             + uVar48 + uVar47 +
             (uVar43 >> 10 ^ (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11)
             );
    iVar24 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
             (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
             uVar37 + uVar52 + ((uVar25 ^ uVar40) & uVar55 ^ uVar40) + 0x2e1b2138;
    uVar39 = uVar39 + iVar24;
    uVar37 = ((uVar35 | uVar53) & uVar54 | uVar35 & uVar53) +
             ((uVar35 * 0x400 | uVar35 >> 0x16) ^
             (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar24;
    uVar50 = (uVar36 >> 3 ^ (uVar36 * 0x4000 | uVar36 >> 0x12) ^ (uVar36 * 0x2000000 | uVar36 >> 7))
             + uVar32 + uVar38 +
             (uVar33 >> 10 ^ (uVar33 * 0x2000 | uVar33 >> 0x13) ^ (uVar33 * 0x8000 | uVar33 >> 0x11)
             );
    iVar24 = ((uVar39 * 0x80 | uVar39 >> 0x19) ^
             (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6)) +
             uVar40 + uVar50 + ((uVar55 ^ uVar25) & uVar39 ^ uVar25) + 0x4d2c6dfc;
    uVar54 = uVar54 + iVar24;
    uVar44 = ((uVar37 | uVar35) & uVar53 | uVar37 & uVar35) +
             ((uVar37 * 0x400 | uVar37 >> 0x16) ^
             (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar24;
    uVar48 = (uVar28 >> 3 ^ (uVar28 * 0x4000 | uVar28 >> 0x12) ^ (uVar28 * 0x2000000 | uVar28 >> 7))
             + uVar36 + uVar29 +
             (uVar52 >> 10 ^ (uVar52 * 0x2000 | uVar52 >> 0x13) ^ (uVar52 * 0x8000 | uVar52 >> 0x11)
             );
    iVar24 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
             (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
             uVar25 + uVar48 + ((uVar39 ^ uVar55) & uVar54 ^ uVar55) + 0x53380d13;
    uVar53 = uVar53 + iVar24;
    uVar40 = ((uVar44 | uVar37) & uVar35 | uVar44 & uVar37) +
             ((uVar44 * 0x400 | uVar44 >> 0x16) ^
             (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar24;
    uVar25 = (uVar34 >> 3 ^ (uVar34 * 0x4000 | uVar34 >> 0x12) ^ (uVar34 * 0x2000000 | uVar34 >> 7))
             + uVar28 + uVar49 +
             (uVar50 >> 10 ^ (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11)
             );
    iVar24 = uVar55 + uVar25 + ((uVar54 ^ uVar39) & uVar53 ^ uVar39) +
             ((uVar53 * 0x80 | uVar53 >> 0x19) ^
             (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) + 0x650a7354;
    uVar35 = uVar35 + iVar24;
    uVar28 = ((uVar40 | uVar44) & uVar37 | uVar40 & uVar44) +
             ((uVar40 * 0x400 | uVar40 >> 0x16) ^
             (uVar40 * 0x80000 | uVar40 >> 0xd) ^ (uVar40 * 0x40000000 | uVar40 >> 2)) + iVar24;
    uVar34 = (uVar42 >> 3 ^ (uVar42 * 0x4000 | uVar42 >> 0x12) ^ (uVar42 * 0x2000000 | uVar42 >> 7))
             + uVar34 + uVar56 +
             (uVar48 >> 10 ^ (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11)
             );
    iVar24 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
             (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
             uVar39 + uVar34 + ((uVar53 ^ uVar54) & uVar35 ^ uVar54) + 0x766a0abb;
    uVar37 = uVar37 + iVar24;
    uVar36 = ((uVar28 | uVar40) & uVar44 | uVar28 & uVar40) +
             ((uVar28 * 0x400 | uVar28 >> 0x16) ^
             (uVar28 * 0x80000 | uVar28 >> 0xd) ^ (uVar28 * 0x40000000 | uVar28 >> 2)) + iVar24;
    uVar31 = (uVar41 >> 3 ^ (uVar41 * 0x4000 | uVar41 >> 0x12) ^ (uVar41 * 0x2000000 | uVar41 >> 7))
             + uVar42 + uVar43 +
             (uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11)
             );
    iVar24 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
             (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
             uVar54 + uVar31 + ((uVar35 ^ uVar53) & uVar37 ^ uVar53) + -0x7e3d36d2;
    uVar44 = uVar44 + iVar24;
    uVar32 = ((uVar36 | uVar28) & uVar40 | uVar36 & uVar28) +
             ((uVar36 * 0x400 | uVar36 >> 0x16) ^
             (uVar36 * 0x80000 | uVar36 >> 0xd) ^ (uVar36 * 0x40000000 | uVar36 >> 2)) + iVar24;
    uVar54 = (uVar46 >> 3 ^ (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7))
             + uVar41 + uVar33 +
             (uVar34 >> 10 ^ (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11)
             );
    iVar24 = ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             uVar53 + uVar54 + ((uVar37 ^ uVar35) & uVar44 ^ uVar35) + -0x6d8dd37b;
    uVar40 = uVar40 + iVar24;
    uVar41 = ((uVar32 | uVar36) & uVar28 | uVar32 & uVar36) +
             ((uVar32 * 0x400 | uVar32 >> 0x16) ^
             (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar24;
    uVar51 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7))
             + uVar46 + uVar52 +
             (uVar31 >> 10 ^ (uVar31 * 0x2000 | uVar31 >> 0x13) ^ (uVar31 * 0x8000 | uVar31 >> 0x11)
             );
    iVar24 = ((uVar40 * 0x80 | uVar40 >> 0x19) ^
             (uVar40 * 0x200000 | uVar40 >> 0xb) ^ (uVar40 * 0x4000000 | uVar40 >> 6)) +
             uVar35 + uVar51 + ((uVar44 ^ uVar37) & uVar40 ^ uVar37) + -0x5d40175f;
    uVar28 = uVar28 + iVar24;
    uVar46 = ((uVar41 | uVar32) & uVar36 | uVar41 & uVar32) +
             ((uVar41 * 0x400 | uVar41 >> 0x16) ^
             (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar24;
    uVar45 = (uVar47 >> 3 ^ (uVar47 * 0x4000 | uVar47 >> 0x12) ^ (uVar47 * 0x2000000 | uVar47 >> 7))
             + uVar45 + uVar50 +
             (uVar54 >> 10 ^ (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11)
             );
    iVar24 = ((uVar28 * 0x80 | uVar28 >> 0x19) ^
             (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
             uVar37 + uVar45 + ((uVar40 ^ uVar44) & uVar28 ^ uVar44) + -0x57e599b5;
    uVar36 = uVar36 + iVar24;
    uVar55 = ((uVar46 | uVar41) & uVar32 | uVar46 & uVar41) +
             ((uVar46 * 0x400 | uVar46 >> 0x16) ^
             (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar24;
    uVar53 = (uVar38 >> 3 ^ (uVar38 * 0x4000 | uVar38 >> 0x12) ^ (uVar38 * 0x2000000 | uVar38 >> 7))
             + uVar47 + uVar48 +
             (uVar51 >> 10 ^ (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11)
             );
    iVar24 = ((uVar36 * 0x80 | uVar36 >> 0x19) ^
             (uVar36 * 0x200000 | uVar36 >> 0xb) ^ (uVar36 * 0x4000000 | uVar36 >> 6)) +
             uVar44 + uVar53 + ((uVar28 ^ uVar40) & uVar36 ^ uVar40) + -0x3db47490;
    uVar32 = uVar32 + iVar24;
    uVar39 = ((uVar55 | uVar46) & uVar41 | uVar55 & uVar46) +
             ((uVar55 * 0x400 | uVar55 >> 0x16) ^
             (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar24;
    uVar35 = (uVar29 >> 3 ^ (uVar29 * 0x4000 | uVar29 >> 0x12) ^ (uVar29 * 0x2000000 | uVar29 >> 7))
             + uVar38 + uVar25 +
             (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11)
             );
    iVar24 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
             (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
             uVar40 + uVar35 + ((uVar36 ^ uVar28) & uVar32 ^ uVar28) + -0x3893ae5d;
    uVar41 = uVar41 + iVar24;
    uVar47 = ((uVar39 | uVar55) & uVar46 | uVar39 & uVar55) +
             ((uVar39 * 0x400 | uVar39 >> 0x16) ^
             (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2)) + iVar24;
    uVar29 = (uVar49 >> 3 ^ (uVar49 * 0x4000 | uVar49 >> 0x12) ^ (uVar49 * 0x2000000 | uVar49 >> 7))
             + uVar29 + uVar34 +
             (uVar53 >> 10 ^ (uVar53 * 0x2000 | uVar53 >> 0x13) ^ (uVar53 * 0x8000 | uVar53 >> 0x11)
             );
    iVar24 = uVar28 + uVar29 + ((uVar32 ^ uVar36) & uVar41 ^ uVar36) +
             ((uVar41 * 0x80 | uVar41 >> 0x19) ^
             (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) + -0x2e6d17e7
    ;
    uVar46 = uVar46 + iVar24;
    uVar42 = ((uVar47 | uVar39) & uVar55 | uVar47 & uVar39) +
             ((uVar47 * 0x400 | uVar47 >> 0x16) ^
             (uVar47 * 0x80000 | uVar47 >> 0xd) ^ (uVar47 * 0x40000000 | uVar47 >> 2)) + iVar24;
    uVar37 = (uVar56 >> 3 ^ (uVar56 * 0x4000 | uVar56 >> 0x12) ^ (uVar56 * 0x2000000 | uVar56 >> 7))
             + uVar49 + uVar31 +
             (uVar35 >> 10 ^ (uVar35 * 0x2000 | uVar35 >> 0x13) ^ (uVar35 * 0x8000 | uVar35 >> 0x11)
             );
    iVar24 = ((uVar46 * 0x80 | uVar46 >> 0x19) ^
             (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
             uVar36 + uVar37 + ((uVar41 ^ uVar32) & uVar46 ^ uVar32) + -0x2966f9dc;
    uVar55 = uVar55 + iVar24;
    uVar44 = ((uVar42 | uVar47) & uVar39 | uVar42 & uVar47) +
             ((uVar42 * 0x400 | uVar42 >> 0x16) ^
             (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar24;
    uVar49 = (uVar43 >> 3 ^ (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7))
             + uVar56 + uVar54 +
             (uVar29 >> 10 ^ (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11)
             );
    iVar24 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
             (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
             uVar32 + uVar49 + ((uVar46 ^ uVar41) & uVar55 ^ uVar41) + -0xbf1ca7b;
    uVar39 = uVar39 + iVar24;
    uVar28 = ((uVar44 | uVar42) & uVar47 | uVar44 & uVar42) +
             ((uVar44 * 0x400 | uVar44 >> 0x16) ^
             (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar24;
    uVar40 = (uVar33 >> 3 ^ (uVar33 * 0x4000 | uVar33 >> 0x12) ^ (uVar33 * 0x2000000 | uVar33 >> 7))
             + uVar43 + uVar51 +
             (uVar37 >> 10 ^ (uVar37 * 0x2000 | uVar37 >> 0x13) ^ (uVar37 * 0x8000 | uVar37 >> 0x11)
             );
    iVar24 = uVar41 + uVar40 + ((uVar55 ^ uVar46) & uVar39 ^ uVar46) +
             ((uVar39 * 0x80 | uVar39 >> 0x19) ^
             (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6)) + 0x106aa070;
    uVar47 = uVar47 + iVar24;
    uVar32 = ((uVar28 | uVar44) & uVar42 | uVar28 & uVar44) +
             ((uVar28 * 0x400 | uVar28 >> 0x16) ^
             (uVar28 * 0x80000 | uVar28 >> 0xd) ^ (uVar28 * 0x40000000 | uVar28 >> 2)) + iVar24;
    uVar36 = (uVar52 >> 3 ^ (uVar52 * 0x4000 | uVar52 >> 0x12) ^ (uVar52 * 0x2000000 | uVar52 >> 7))
             + uVar33 + uVar45 +
             (uVar49 >> 10 ^ (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11)
             );
    iVar24 = ((uVar47 * 0x80 | uVar47 >> 0x19) ^
             (uVar47 * 0x200000 | uVar47 >> 0xb) ^ (uVar47 * 0x4000000 | uVar47 >> 6)) +
             uVar46 + uVar36 + ((uVar39 ^ uVar55) & uVar47 ^ uVar55) + 0x19a4c116;
    uVar42 = uVar42 + iVar24;
    uVar56 = ((uVar32 | uVar28) & uVar44 | uVar32 & uVar28) +
             ((uVar32 * 0x400 | uVar32 >> 0x16) ^
             (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar24;
    uVar52 = (uVar50 >> 3 ^ (uVar50 * 0x4000 | uVar50 >> 0x12) ^ (uVar50 * 0x2000000 | uVar50 >> 7))
             + uVar52 + uVar53 +
             (uVar40 >> 10 ^ (uVar40 * 0x2000 | uVar40 >> 0x13) ^ (uVar40 * 0x8000 | uVar40 >> 0x11)
             );
    iVar24 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
             (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
             uVar55 + uVar52 + ((uVar47 ^ uVar39) & uVar42 ^ uVar39) + 0x1e376c08;
    uVar44 = uVar44 + iVar24;
    uVar33 = ((uVar56 | uVar32) & uVar28 | uVar56 & uVar32) +
             ((uVar56 * 0x400 | uVar56 >> 0x16) ^
             (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar24;
    uVar43 = (uVar48 >> 3 ^ (uVar48 * 0x4000 | uVar48 >> 0x12) ^ (uVar48 * 0x2000000 | uVar48 >> 7))
             + uVar50 + uVar35 +
             (uVar36 >> 10 ^ (uVar36 * 0x2000 | uVar36 >> 0x13) ^ (uVar36 * 0x8000 | uVar36 >> 0x11)
             );
    iVar24 = ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
             uVar39 + uVar43 + ((uVar42 ^ uVar47) & uVar44 ^ uVar47) + 0x2748774c;
    uVar28 = uVar28 + iVar24;
    uVar38 = ((uVar33 | uVar56) & uVar32 | uVar33 & uVar56) +
             ((uVar33 * 0x400 | uVar33 >> 0x16) ^
             (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar24;
    uVar39 = (uVar25 >> 3 ^ (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7))
             + uVar48 + uVar29 +
             (uVar52 >> 10 ^ (uVar52 * 0x2000 | uVar52 >> 0x13) ^ (uVar52 * 0x8000 | uVar52 >> 0x11)
             );
    iVar24 = ((uVar28 * 0x80 | uVar28 >> 0x19) ^
             (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
             uVar47 + uVar39 + ((uVar44 ^ uVar42) & uVar28 ^ uVar42) + 0x34b0bcb5;
    uVar32 = uVar32 + iVar24;
    uVar46 = ((uVar38 | uVar33) & uVar56 | uVar38 & uVar33) +
             ((uVar38 * 0x400 | uVar38 >> 0x16) ^
             (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar24;
    uVar47 = (uVar34 >> 3 ^ (uVar34 * 0x4000 | uVar34 >> 0x12) ^ (uVar34 * 0x2000000 | uVar34 >> 7))
             + uVar25 + uVar37 +
             (uVar43 >> 10 ^ (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11)
             );
    iVar24 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
             (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
             uVar42 + uVar47 + ((uVar28 ^ uVar44) & uVar32 ^ uVar44) + 0x391c0cb3;
    uVar56 = uVar56 + iVar24;
    uVar50 = ((uVar46 | uVar38) & uVar33 | uVar46 & uVar38) +
             ((uVar46 * 0x400 | uVar46 >> 0x16) ^
             (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar24;
    uVar41 = (uVar31 >> 3 ^ (uVar31 * 0x4000 | uVar31 >> 0x12) ^ (uVar31 * 0x2000000 | uVar31 >> 7))
             + uVar34 + uVar49 +
             (uVar39 >> 10 ^ (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11)
             );
    iVar24 = ((uVar56 * 0x80 | uVar56 >> 0x19) ^
             (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) +
             uVar44 + uVar41 + ((uVar32 ^ uVar28) & uVar56 ^ uVar28) + 0x4ed8aa4a;
    uVar33 = uVar33 + iVar24;
    uVar34 = ((uVar50 | uVar46) & uVar38 | uVar50 & uVar46) +
             ((uVar50 * 0x400 | uVar50 >> 0x16) ^
             (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar24;
    uVar42 = (uVar54 >> 3 ^ (uVar54 * 0x4000 | uVar54 >> 0x12) ^ (uVar54 * 0x2000000 | uVar54 >> 7))
             + uVar31 + uVar40 +
             (uVar47 >> 10 ^ (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11)
             );
    iVar24 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
             (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
             uVar28 + uVar42 + ((uVar56 ^ uVar32) & uVar33 ^ uVar32) + 0x5b9cca4f;
    uVar38 = uVar38 + iVar24;
    uVar25 = ((uVar34 | uVar50) & uVar46 | uVar34 & uVar50) +
             ((uVar34 * 0x400 | uVar34 >> 0x16) ^
             (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar24;
    uVar28 = (uVar51 >> 3 ^ (uVar51 * 0x4000 | uVar51 >> 0x12) ^ (uVar51 * 0x2000000 | uVar51 >> 7))
             + uVar54 + uVar36 +
             (uVar41 >> 10 ^ (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11)
             );
    iVar24 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
             (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
             uVar32 + uVar28 + ((uVar33 ^ uVar56) & uVar38 ^ uVar56) + 0x682e6ff3;
    uVar46 = uVar46 + iVar24;
    uVar32 = ((uVar25 | uVar34) & uVar50 | uVar25 & uVar34) +
             ((uVar25 * 0x400 | uVar25 >> 0x16) ^
             (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar24;
    uVar54 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7))
             + uVar51 + uVar52 +
             (uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11)
             );
    iVar24 = ((uVar46 * 0x80 | uVar46 >> 0x19) ^
             (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6)) +
             uVar56 + uVar54 + ((uVar38 ^ uVar33) & uVar46 ^ uVar33) + 0x748f82ee;
    uVar50 = uVar50 + iVar24;
    uVar48 = ((uVar32 | uVar25) & uVar34 | uVar32 & uVar25) +
             ((uVar32 * 0x400 | uVar32 >> 0x16) ^
             (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar24;
    uVar45 = (uVar53 >> 3 ^ (uVar53 * 0x4000 | uVar53 >> 0x12) ^ (uVar53 * 0x2000000 | uVar53 >> 7))
             + uVar45 + uVar43 +
             (uVar28 >> 10 ^ (uVar28 * 0x2000 | uVar28 >> 0x13) ^ (uVar28 * 0x8000 | uVar28 >> 0x11)
             );
    iVar24 = ((uVar50 * 0x80 | uVar50 >> 0x19) ^
             (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) +
             uVar33 + uVar45 + ((uVar46 ^ uVar38) & uVar50 ^ uVar38) + 0x78a5636f;
    uVar34 = uVar34 + iVar24;
    uVar31 = ((uVar48 | uVar32) & uVar25 | uVar48 & uVar32) +
             ((uVar48 * 0x400 | uVar48 >> 0x16) ^
             (uVar48 * 0x80000 | uVar48 >> 0xd) ^ (uVar48 * 0x40000000 | uVar48 >> 2)) + iVar24;
    uVar39 = (uVar35 >> 3 ^ (uVar35 * 0x4000 | uVar35 >> 0x12) ^ (uVar35 * 0x2000000 | uVar35 >> 7))
             + uVar53 + uVar39 +
             (uVar54 >> 10 ^ (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11)
             );
    iVar24 = ((uVar34 * 0x80 | uVar34 >> 0x19) ^
             (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) +
             uVar38 + uVar39 + ((uVar50 ^ uVar46) & uVar34 ^ uVar46) + -0x7b3787ec;
    uVar25 = uVar25 + iVar24;
    uVar53 = ((uVar31 | uVar48) & uVar32 | uVar31 & uVar48) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar24;
    uVar45 = (uVar29 >> 3 ^ (uVar29 * 0x4000 | uVar29 >> 0x12) ^ (uVar29 * 0x2000000 | uVar29 >> 7))
             + uVar35 + uVar47 +
             (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11)
             );
    iVar24 = ((uVar25 * 0x80 | uVar25 >> 0x19) ^
             (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) +
             uVar46 + uVar45 + ((uVar34 ^ uVar50) & uVar25 ^ uVar50) + -0x7338fdf8;
    uVar32 = uVar32 + iVar24;
    uVar52 = ((uVar53 | uVar31) & uVar48 | uVar53 & uVar31) +
             ((uVar53 * 0x400 | uVar53 >> 0x16) ^
             (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar24;
    uVar41 = (uVar37 >> 3 ^ (uVar37 * 0x4000 | uVar37 >> 0x12) ^ (uVar37 * 0x2000000 | uVar37 >> 7))
             + uVar29 + uVar41 +
             (uVar39 >> 10 ^ (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11)
             );
    iVar24 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
             (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
             uVar50 + uVar41 + ((uVar25 ^ uVar34) & uVar32 ^ uVar34) + -0x6f410006;
    uVar48 = uVar48 + iVar24;
    uVar29 = ((uVar52 | uVar53) & uVar31 | uVar52 & uVar53) +
             ((uVar52 * 0x400 | uVar52 >> 0x16) ^
             (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar24;
    uVar45 = (uVar49 >> 3 ^ (uVar49 * 0x4000 | uVar49 >> 0x12) ^ (uVar49 * 0x2000000 | uVar49 >> 7))
             + uVar37 + uVar42 +
             (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11)
             );
    iVar24 = ((uVar48 * 0x80 | uVar48 >> 0x19) ^
             (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6)) +
             uVar34 + uVar45 + ((uVar32 ^ uVar25) & uVar48 ^ uVar25) + -0x5baf9315;
    uVar31 = uVar31 + iVar24;
    uVar39 = ((uVar29 | uVar52) & uVar53 | uVar29 & uVar52) +
             ((uVar29 * 0x400 | uVar29 >> 0x16) ^
             (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar24;
    iVar24 = (uVar40 >> 3 ^ (uVar40 * 0x4000 | uVar40 >> 0x12) ^ (uVar40 * 0x2000000 | uVar40 >> 7))
             + uVar49 + uVar28 +
             (uVar41 >> 10 ^ (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11)
             ) + uVar25 + ((uVar48 ^ uVar32) & uVar31 ^ uVar32) +
             ((uVar31 * 0x80 | uVar31 >> 0x19) ^
             (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) + -0x41065c09
    ;
    uVar53 = uVar53 + iVar24;
    uVar25 = ((uVar39 | uVar29) & uVar52 | uVar39 & uVar29) +
             ((uVar39 * 0x400 | uVar39 >> 0x16) ^
             (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2)) + iVar24;
    iVar24 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
             (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
             (uVar36 >> 3 ^ (uVar36 * 0x4000 | uVar36 >> 0x12) ^ (uVar36 * 0x2000000 | uVar36 >> 7))
             + uVar40 + uVar54 +
             (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11)
             ) + uVar32 + ((uVar31 ^ uVar48) & uVar53 ^ uVar48) + -0x398e870e;
    hash->s[0] = ((uVar25 | uVar39) & uVar29 | uVar25 & uVar39) + uVar27 +
                 ((uVar25 * 0x400 | uVar25 >> 0x16) ^
                 (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar24;
    hash->s[1] = uVar25 + uVar1;
    hash->s[2] = uVar39 + uVar2;
    hash->s[3] = uVar29 + uVar3;
    hash->s[4] = uVar52 + uVar4 + iVar24;
    hash->s[5] = uVar53 + uVar5;
    hash->s[6] = uVar31 + uVar6;
    hash->s[7] = uVar48 + uVar7;
    uVar27 = 0;
    len = len - uVar26;
  }
  if (len != 0) {
    memcpy(p + uVar30,local_140,len);
    return;
  }
  return;
}

Assistant:

static void secp256k1_sha256_write(secp256k1_sha256 *hash, const unsigned char *data, size_t len) {
    size_t bufsize = hash->bytes & 0x3F;
    hash->bytes += len;
    VERIFY_CHECK(hash->bytes >= len);
    while (len >= 64 - bufsize) {
        /* Fill the buffer, and process it. */
        size_t chunk_len = 64 - bufsize;
        memcpy(hash->buf + bufsize, data, chunk_len);
        data += chunk_len;
        len -= chunk_len;
        secp256k1_sha256_transform(hash->s, hash->buf);
        bufsize = 0;
    }
    if (len) {
        /* Fill the buffer with what remains. */
        memcpy(hash->buf + bufsize, data, len);
    }
}